

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O0

ssize_t __thiscall input::read(input *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  undefined4 in_register_00000034;
  void *local_18;
  
  sVar1 = this->pos;
  uVar2 = std::__cxx11::string::size();
  local_18 = __buf;
  if (uVar2 < (long)__buf + sVar1) {
    lVar3 = std::__cxx11::string::size();
    local_18 = (void *)(lVar3 - this->pos);
  }
  lVar3 = std::__cxx11::string::c_str();
  memcpy((void *)CONCAT44(in_register_00000034,__fd),(void *)(lVar3 + this->pos),(size_t)local_18);
  this->pos = (long)local_18 + this->pos;
  return (ssize_t)local_18;
}

Assistant:

size_t read(char *p,size_t n)
	{
		if( n + pos > buf->size())
			n=buf->size() - pos;
		memcpy(p,buf->c_str()+pos,n);
		pos+=n;
		return n;
	}